

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O3

void __thiscall
xLearn::FMScore::calc_grad_adagrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t rVar3;
  uint uVar4;
  real_t *prVar5;
  int iVar6;
  pointer pNVar7;
  float fVar8;
  ulong uVar9;
  pointer pNVar10;
  ulong uVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar16 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar17 [64];
  float fVar18;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM8 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_79;
  real_t local_78;
  float local_74;
  real_t local_70;
  value_type_conflict1 local_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> local_40;
  
  auVar24 = in_ZMM8._0_16_;
  auVar17._4_60_ = in_register_00001244;
  auVar17._0_4_ = norm;
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = pg;
  auVar15 = auVar16._0_16_;
  local_78 = pg;
  local_70 = norm;
  if (norm < 0.0) {
    fVar8 = sqrtf(norm);
    auVar15 = ZEXT416((uint)local_78);
  }
  else {
    auVar19 = vsqrtss_avx(auVar17._0_16_,auVar17._0_16_);
    fVar8 = auVar19._0_4_;
  }
  uVar4 = model->num_feat_;
  pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar7 != pNVar10) {
    prVar5 = model->param_w_;
    do {
      if (pNVar7->feat_id < uVar4) {
        uVar11 = (ulong)(pNVar7->feat_id * 2);
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * auVar15._0_4_ * pNVar7->feat_val)),
                                  ZEXT416((uint)prVar5[uVar11]),
                                  ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)prVar5[uVar11 + 1]),auVar23,auVar23);
        fVar18 = auVar19._0_4_;
        prVar5[uVar11 + 1] = fVar18;
        fVar12 = (float)(0x5f375a86 - ((int)fVar18 >> 1));
        auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar18 * -0.5 * fVar12)),ZEXT416((uint)fVar12),
                                  SUB6416(ZEXT464(0x3fc00000),0));
        auVar19 = vfnmadd213ss_fma(ZEXT416((uint)(auVar23._0_4_ * (this->super_Score).learning_rate_
                                                 )),ZEXT416((uint)(auVar19._0_4_ * fVar12)),
                                   ZEXT416((uint)prVar5[uVar11]));
        prVar5[uVar11] = auVar19._0_4_;
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 != pNVar10);
  }
  prVar5 = model->param_b_;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)prVar5[1]),auVar15,auVar15);
  fVar12 = auVar19._0_4_;
  prVar5[1] = fVar12;
  fVar8 = (float)(0x5f375a86 - ((int)fVar12 >> 1));
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar12 * -0.5 * fVar8)),ZEXT416((uint)fVar8),
                            ZEXT416(0x3fc00000));
  auVar15 = vfnmadd213ss_fma(ZEXT416((uint)(auVar15._0_4_ * (this->super_Score).learning_rate_)),
                             ZEXT416((uint)(auVar19._0_4_ * fVar8)),ZEXT416((uint)*prVar5));
  *prVar5 = auVar15._0_4_;
  auVar15 = vcvtusi2ss_avx512f(auVar24,model->num_K_);
  rVar3 = (this->super_Score).regu_lambda_;
  local_68._4_4_ = rVar3;
  local_68._0_4_ = rVar3;
  fStack_60 = rVar3;
  fStack_5c = rVar3;
  auVar15 = ZEXT416((uint)(auVar15._0_4_ * 0.25));
  auVar15 = vroundss_avx(auVar15,auVar15,10);
  uVar14 = vcvttss2usi_avx512f(auVar15);
  local_58 = (this->super_Score).learning_rate_;
  uVar11 = (ulong)(uVar14 << 2);
  auVar15 = vcvtusi2ss_avx512f(auVar24,model->aux_size_);
  local_6c = 0.0;
  local_74 = auVar15._0_4_;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  std::vector<float,_std::allocator<float>_>::vector(&local_40,uVar11,&local_6c,&local_79);
  pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar7 != pNVar10) {
    auVar15 = vcvtusi2ss_avx512f(auVar24,uVar14 << 2);
    iVar6 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar15._0_4_ * local_74)));
    do {
      uVar13 = pNVar7->feat_id;
      if ((uVar13 < uVar4) && (uVar11 != 0)) {
        fVar8 = local_70 * pNVar7->feat_val;
        uVar9 = 0;
        prVar5 = model->param_v_;
        do {
          pfVar1 = prVar5 + uVar13 * iVar6 + uVar9;
          pfVar2 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          auVar15._0_4_ = fVar8 * *pfVar1 + *pfVar2;
          auVar15._4_4_ = fVar8 * pfVar1[1] + pfVar2[1];
          auVar15._8_4_ = fVar8 * pfVar1[2] + pfVar2[2];
          auVar15._12_4_ = fVar8 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar9) = auVar15;
          uVar9 = uVar9 + 4;
        } while (uVar9 < uVar11);
        pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 != pNVar10);
    pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pNVar7 != pNVar10) {
      do {
        if ((pNVar7->feat_id < uVar4) && ((uVar14 & 0x3fffffff) != 0)) {
          fVar8 = local_70 * pNVar7->feat_val;
          uVar13 = pNVar7->feat_id * iVar6;
          uVar9 = 0;
          prVar5 = model->param_v_;
          fVar12 = fVar8 * local_78;
          do {
            auVar15 = *(undefined1 (*) [16])(prVar5 + uVar13 + uVar9);
            auVar24._0_4_ = fVar8 * auVar15._0_4_;
            auVar24._4_4_ = fVar8 * auVar15._4_4_;
            auVar24._8_4_ = fVar8 * auVar15._8_4_;
            auVar24._12_4_ = fVar8 * auVar15._12_4_;
            auVar24 = vsubps_avx(*(undefined1 (*) [16])
                                  (local_40.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar9),auVar24);
            fVar18 = (float)local_68._0_4_ * auVar15._0_4_ + fVar12 * auVar24._0_4_;
            fVar20 = (float)local_68._4_4_ * auVar15._4_4_ + fVar12 * auVar24._4_4_;
            fVar21 = fStack_60 * auVar15._8_4_ + fVar12 * auVar24._8_4_;
            fVar22 = fStack_5c * auVar15._12_4_ + fVar12 * auVar24._12_4_;
            pfVar1 = prVar5 + (ulong)uVar13 + uVar11 + uVar9;
            auVar23._0_4_ = fVar18 * fVar18 + *pfVar1;
            auVar23._4_4_ = fVar20 * fVar20 + pfVar1[1];
            auVar23._8_4_ = fVar21 * fVar21 + pfVar1[2];
            auVar23._12_4_ = fVar22 * fVar22 + pfVar1[3];
            auVar24 = vrsqrtps_avx(auVar23);
            auVar19._0_4_ = local_58 * auVar24._0_4_ * fVar18;
            auVar19._4_4_ = fStack_54 * auVar24._4_4_ * fVar20;
            auVar19._8_4_ = fStack_50 * auVar24._8_4_ * fVar21;
            auVar19._12_4_ = fStack_4c * auVar24._12_4_ * fVar22;
            auVar15 = vsubps_avx(auVar15,auVar19);
            *(undefined1 (*) [16])(prVar5 + uVar13 + uVar9) = auVar15;
            *(undefined1 (*) [16])(prVar5 + (ulong)uVar13 + uVar11 + uVar9) = auVar23;
            uVar9 = uVar9 + 4;
          } while (uVar9 < uVar11);
          pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        pNVar7 = pNVar7 + 1;
      } while (pNVar7 != pNVar10);
    }
  }
  if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FMScore::calc_grad_adagrad(const SparseRow* row,
                                Model& model,
                                real_t pg,
                                real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
      iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwg = _mm_load_ps(w+aligned_k+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
      _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMwg = _mm_add_ps(XMMwg, _mm_mul_ps(XMMg, XMMg));
      XMMw = _mm_sub_ps(XMMw,
             _mm_mul_ps(XMMlr,
             _mm_mul_ps(_mm_rsqrt_ps(XMMwg), XMMg)));
      _mm_store_ps(w+d, XMMw);
      _mm_store_ps(w+aligned_k+d, XMMwg);
    }
  }
}